

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void pmulhrsw_(PDISASM pMyDisasm)

{
  _Bool _Var1;
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      strcpy((pMyDisasm->Instruction).Mnemonic,"vpmulhrsw");
      if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
        (pMyDisasm->Reserved_).EVEX.tupletype = '\x03';
      }
      ArgsVEX(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    (pMyDisasm->Reserved_).MemDecoration = 0x6d;
    (pMyDisasm->Instruction).Category = 0x70002;
    strcpy((pMyDisasm->Instruction).Mnemonic,"pmulhrsw");
    (pMyDisasm->Reserved_).Register_ = 4;
    GxEx(pMyDisasm);
    (pMyDisasm->Operand1).AccessMode = 3;
  }
  else {
    _Var1 = prefixes_present(pMyDisasm);
    if (_Var1) {
      failDecode(pMyDisasm);
    }
    else {
      (pMyDisasm->Reserved_).MemDecoration = 0x68;
      (pMyDisasm->Instruction).Category = 0x70002;
      strcpy((pMyDisasm->Instruction).Mnemonic,"pmulhrsw");
      (pMyDisasm->Reserved_).Register_ = 2;
      GxEx(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 3;
    }
  }
  return;
}

Assistant:

void __bea_callspec__ pmulhrsw_(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpmulhrsw");
      #endif
      if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL_MEM;
      ArgsVEX(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }
   /* ========== 0x66 */
  else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
    GV.OperandSize = GV.OriginalOperandSize;
    pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
    GV.MemDecoration = Arg2_m128_xmm;
    pMyDisasm->Instruction.Category = SSSE3_INSTRUCTION+ARITHMETIC_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pmulhrsw");
    #endif
    GV.Register_ = SSE_REG;
    GxEx(pMyDisasm);
    pMyDisasm->Operand1.AccessMode = READ + WRITE;
  }
  else {
    if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return; }
    GV.MemDecoration = Arg2qword;
    pMyDisasm->Instruction.Category = SSSE3_INSTRUCTION+ARITHMETIC_INSTRUCTION;
    #ifndef BEA_LIGHT_DISASSEMBLY
      (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pmulhrsw");
    #endif
    GV.Register_ = MMX_REG;
    GxEx(pMyDisasm);
    pMyDisasm->Operand1.AccessMode = READ + WRITE;
  }
}